

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)122,(moira::Mode)8,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  char **s;
  Syntax SVar1;
  int iVar2;
  uint uVar3;
  u64 value;
  char cVar4;
  char *pcVar5;
  long lVar6;
  Ea<(moira::Mode)8,_2> dst;
  u32 local_3c;
  ushort local_38;
  uint local_34;
  
  local_38 = op & 7;
  local_3c = *addr;
  *addr = local_3c + 2;
  iVar2 = (*this->_vptr_Moira[6])();
  *addr = *addr + 2;
  uVar3 = (*this->_vptr_Moira[6])(this);
  local_34 = uVar3 & 0xffff | iVar2 << 0x10;
  value = 8;
  if ((op & 0xe00) != 0) {
    value = (ulong)((byte)(op >> 9) & 7);
  }
  s = &str->ptr;
  if (str->style->syntax == MUSASHI) {
    cVar4 = 's';
    lVar6 = 0;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "subq"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = *s;
      *s = pcVar5 + 1;
    }
    *pcVar5 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    sprintd(s,value);
  }
  else {
    cVar4 = 's';
    lVar6 = 0;
    do {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = cVar4;
      cVar4 = "subq"[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    pcVar5 = str->ptr;
    SVar1 = str->style->syntax;
    str->ptr = pcVar5 + 1;
    if (2 < SVar1 - MOIRA_MIT) {
      *pcVar5 = '.';
      pcVar5 = *s;
      *s = pcVar5 + 1;
    }
    *pcVar5 = 'w';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar5 = *s;
      *s = pcVar5 + 1;
      *pcVar5 = ' ';
      pcVar5 = *s;
    }
    else {
      iVar2 = (str->tab).raw;
      pcVar5 = str->ptr;
      do {
        str->ptr = pcVar5 + 1;
        *pcVar5 = ' ';
        pcVar5 = str->ptr;
      } while (pcVar5 < str->base + iVar2);
    }
    str->ptr = pcVar5 + 1;
    *pcVar5 = '#';
    StrWriter::operator<<(str,(Int)(i32)value);
  }
  pcVar5 = str->ptr;
  str->ptr = pcVar5 + 1;
  *pcVar5 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar5 = *s;
    *s = pcVar5 + 1;
    *pcVar5 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_2> *)&local_3c);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src =          ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src == 0) src = 8;

    switch (str.style.syntax) {

        case  Syntax::MUSASHI:

            str << Ins<I>{} << Sz<S>{} << str.tab << Imd{src} << Sep{} << dst;
            break;

        default:

            str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>{src} << Sep{} << dst;
    }
}